

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

void sse::ProjectionProfile
               (uint32_t rowSize,uint8_t *imageStart,uint32_t height,bool horizontal,uint32_t *out,
               uint32_t simdWidth,uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint8_t *puVar7;
  undefined7 in_register_00000009;
  uint8_t *puVar8;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  
  auVar11 = _DAT_0011d630;
  if ((int)CONCAT71(in_register_00000009,horizontal) == 0) {
    puVar7 = imageStart + totalSimdWidth;
    puVar8 = imageStart + height * rowSize;
    while (imageStart != puVar8) {
      auVar12 = ZEXT1664((undefined1  [16])0x0);
      lVar10 = 0;
      while (auVar11 = auVar12._0_16_, (ulong)simdWidth << 4 != lVar10) {
        pauVar1 = (undefined1 (*) [16])(imageStart + lVar10);
        lVar10 = lVar10 + 0x10;
        auVar2 = vpmovzxbw_avx(*pauVar1);
        auVar3 = vpunpckhbw_avx(*pauVar1,(undefined1  [16])0x0);
        auVar2 = vpaddw_avx(auVar2,auVar3);
        auVar3 = vpmovzxwd_avx(auVar2);
        auVar2 = vpunpckhwd_avx(auVar2,(undefined1  [16])0x0);
        auVar11 = vpaddd_avx(auVar11,auVar2);
        auVar11 = vpaddd_avx(auVar11,auVar3);
        auVar12 = ZEXT1664(auVar11);
      }
      if (nonSimdWidth != 0) {
        for (uVar9 = 0; nonSimdWidth != uVar9; uVar9 = uVar9 + 1) {
          *out = *out + (uint)puVar7[uVar9];
        }
      }
      auVar11 = vphaddd_avx(auVar11,auVar11);
      imageStart = imageStart + rowSize;
      puVar7 = puVar7 + rowSize;
      auVar11 = vphaddd_avx(auVar11,auVar11);
      *out = *out + auVar11._0_4_;
      out = out + 1;
    }
  }
  else {
    puVar8 = imageStart + totalSimdWidth;
    while (imageStart != puVar8) {
      auVar12 = ZEXT1664((undefined1  [16])0x0);
      auVar13 = ZEXT1664((undefined1  [16])0x0);
      auVar14 = ZEXT1664((undefined1  [16])0x0);
      auVar15 = ZEXT1664((undefined1  [16])0x0);
      uVar9 = 0;
      while( true ) {
        if (height * rowSize == uVar9) break;
        auVar2 = *(undefined1 (*) [16])(imageStart + uVar9);
        uVar9 = uVar9 + rowSize;
        auVar6 = vpunpckhbw_avx(auVar2,(undefined1  [16])0x0);
        auVar3 = vpmovzxbd_avx(auVar2);
        auVar5 = vpshufb_avx(auVar2,auVar11);
        auVar4 = vpmovzxwd_avx(auVar6);
        auVar6 = vpunpckhwd_avx(auVar6,(undefined1  [16])0x0);
        auVar2 = vpaddd_avx(auVar3,auVar15._0_16_);
        auVar15 = ZEXT1664(auVar2);
        auVar2 = vpaddd_avx(auVar14._0_16_,auVar5);
        auVar14 = ZEXT1664(auVar2);
        auVar2 = vpaddd_avx(auVar12._0_16_,auVar6);
        auVar12 = ZEXT1664(auVar2);
        auVar2 = vpaddd_avx(auVar4,auVar13._0_16_);
        auVar13 = ZEXT1664(auVar2);
      }
      auVar2 = vpaddd_avx(auVar15._0_16_,*(undefined1 (*) [16])out);
      imageStart = imageStart + 0x10;
      *(undefined1 (*) [16])out = auVar2;
      auVar2 = vpaddd_avx(auVar14._0_16_,*(undefined1 (*) [16])((long)out + 0x10));
      *(undefined1 (*) [16])((long)out + 0x10) = auVar2;
      auVar2 = vpaddd_avx(auVar13._0_16_,*(undefined1 (*) [16])((long)out + 0x20));
      *(undefined1 (*) [16])((long)out + 0x20) = auVar2;
      auVar2 = vpaddd_avx(auVar12._0_16_,*(undefined1 (*) [16])((long)out + 0x30));
      *(undefined1 (*) [16])((long)out + 0x30) = auVar2;
      out = (uint32_t *)((long)out + 0x40);
    }
    if (nonSimdWidth != 0) {
      puVar7 = puVar8 + nonSimdWidth;
      for (; puVar8 != puVar7; puVar8 = puVar8 + 1) {
        for (uVar9 = 0; height * rowSize != uVar9; uVar9 = uVar9 + rowSize) {
          *(uint *)*(undefined1 (*) [16])out =
               *(int *)*(undefined1 (*) [16])out + (uint)puVar8[uVar9];
        }
        out = (uint32_t *)(*(undefined1 (*) [16])out + 4);
      }
    }
  }
  return;
}

Assistant:

void ProjectionProfile( uint32_t rowSize, const uint8_t * imageStart, uint32_t height, bool horizontal,
                            uint32_t * out, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const simd zero = _mm_setzero_si128();

        if( horizontal ) {
            const uint8_t * imageSimdXEnd = imageStart + totalSimdWidth;

            for( ; imageStart != imageSimdXEnd; imageStart += simdSize, out += simdSize ) {
                const uint8_t * imageSimdY    = imageStart;
                const uint8_t * imageSimdYEnd = imageSimdY + height * rowSize;
                simd simdSum_1 = _mm_setzero_si128();
                simd simdSum_2 = _mm_setzero_si128();
                simd simdSum_3 = _mm_setzero_si128();
                simd simdSum_4 = _mm_setzero_si128();

                simd * dst = reinterpret_cast <simd*> (out);

                for( ; imageSimdY != imageSimdYEnd; imageSimdY += rowSize) {
                    const simd * src    = reinterpret_cast <const simd*> (imageSimdY);

                    const simd data = _mm_loadu_si128( src );

                    const simd dataLo  = _mm_unpacklo_epi8( data, zero );
                    const simd dataHi  = _mm_unpackhi_epi8( data, zero );

                    const simd data_1 = _mm_unpacklo_epi16( dataLo, zero );
                    const simd data_2 = _mm_unpackhi_epi16( dataLo, zero );
                    const simd data_3 = _mm_unpacklo_epi16( dataHi, zero );
                    const simd data_4 = _mm_unpackhi_epi16( dataHi, zero );
                    simdSum_1 = _mm_add_epi32( data_1, simdSum_1 );
                    simdSum_2 = _mm_add_epi32( data_2, simdSum_2 );
                    simdSum_3 = _mm_add_epi32( data_3, simdSum_3 );
                    simdSum_4 = _mm_add_epi32( data_4, simdSum_4 );
                }

                _mm_storeu_si128( dst, _mm_add_epi32( simdSum_1, _mm_loadu_si128( dst ) ) );
                ++dst;
                _mm_storeu_si128( dst, _mm_add_epi32( simdSum_2, _mm_loadu_si128( dst ) ) );
                ++dst;
                _mm_storeu_si128( dst, _mm_add_epi32( simdSum_3, _mm_loadu_si128( dst ) ) );
                ++dst;
                _mm_storeu_si128( dst, _mm_add_epi32( simdSum_4, _mm_loadu_si128( dst ) ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * imageXEnd = imageStart + nonSimdWidth;

                for( ; imageStart != imageXEnd; ++imageStart, ++out ) {
                    const uint8_t * imageY    = imageStart;
                    const uint8_t * imageYEnd = imageY + height * rowSize;

                    for( ; imageY != imageYEnd; imageY += rowSize )
                        (*out) += (*imageY);
                }
            }
        }
        else {
            const uint8_t * imageYEnd = imageStart + height * rowSize;

            for( ; imageStart != imageYEnd; imageStart += rowSize, ++out ) {
                const simd * src    = reinterpret_cast <const simd*> (imageStart);
                const simd * srcEnd = src + simdWidth;
                simd simdSum = _mm_setzero_si128();

                for( ; src != srcEnd; ++src ) {
                    simd data = _mm_loadu_si128( src );

                    simd dataLo  = _mm_unpacklo_epi8( data, zero );
                    simd dataHi  = _mm_unpackhi_epi8( data, zero );
                    simd sumLoHi = _mm_add_epi16( dataLo, dataHi );

                    simdSum = _mm_add_epi32( simdSum, _mm_add_epi32( _mm_unpacklo_epi16( sumLoHi, zero ),
                                                                     _mm_unpackhi_epi16( sumLoHi, zero ) ) );
                }

                if( nonSimdWidth > 0 ) {
                    const uint8_t * imageX    = imageStart + totalSimdWidth;
                    const uint8_t * imageXEnd = imageX + nonSimdWidth;

                    for( ; imageX != imageXEnd; ++imageX )
                        (*out) += (*imageX);
                }

                uint32_t output[4] = { 0 };
                _mm_storeu_si128( reinterpret_cast <simd*>(output), simdSum );
                
                (*out) += output[0] + output[1] + output[2] + output[3];
            }
        }
    }